

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::CopyImage::SmokeTest::compareImages
          (SmokeTest *this,testCase *test_case,GLubyte *left_data,GLubyte *right_data)

{
  GLubyte *left_pixel_data;
  GLubyte *right_pixel_data;
  ostringstream *this_00;
  uint left_internal_format;
  bool bVar1;
  GLuint left_pixel_size;
  ulong uVar2;
  GLubyte *pixel;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  left_pixel_size = Utils::getPixelSizeForFormat(test_case->m_internal_format);
  uVar3 = 0x10;
  if (test_case->m_target == 0x8c18) {
    uVar3 = 1;
  }
  if (test_case->m_target == 0xde0) {
    uVar3 = 1;
  }
  lVar6 = 0;
  uVar2 = 0;
  do {
    if (uVar2 == uVar3) {
LAB_00947e70:
      return uVar3 <= uVar2;
    }
    lVar5 = lVar6;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      left_pixel_data = left_data + lVar5;
      right_pixel_data = right_data + lVar5;
      bVar1 = Utils::comparePixels
                        (left_pixel_size,left_pixel_data,left_pixel_size,right_pixel_data,
                         test_case->m_internal_format);
      if (!bVar1) {
        left_internal_format = test_case->m_internal_format;
        pixel = (GLubyte *)(ulong)left_internal_format;
        bVar1 = Utils::unpackAndComaprePixels
                          (test_case->m_format,test_case->m_type,left_internal_format,
                           left_pixel_data,test_case->m_format,test_case->m_type,
                           left_internal_format,right_pixel_data);
        if (!bVar1) {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Not matching pixels found. ");
          std::operator<<((ostream *)this_00,"[");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00,"], off: ");
          std::ostream::_M_insert<long>((long)this_00);
          std::operator<<((ostream *)this_00,". Data left: ");
          Utils::getPixelString_abi_cxx11_
                    (&local_1d0,(Utils *)(ulong)test_case->m_internal_format,(GLenum)left_pixel_data
                     ,pixel);
          std::operator<<((ostream *)this_00,(string *)&local_1d0);
          std::operator<<((ostream *)this_00,", right: ");
          Utils::getPixelString_abi_cxx11_
                    (&local_1f0,(Utils *)(ulong)test_case->m_internal_format,
                     (GLenum)right_pixel_data,pixel);
          std::operator<<((ostream *)this_00,(string *)&local_1f0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          goto LAB_00947e70;
        }
      }
      lVar5 = lVar5 + (ulong)left_pixel_size;
    }
    uVar2 = uVar2 + 1;
    lVar6 = lVar6 + (ulong)(left_pixel_size << 4);
  } while( true );
}

Assistant:

bool SmokeTest::compareImages(const testCase& test_case, const GLubyte* left_data, const GLubyte* right_data) const
{
	/* Constants */
	/* Sizes */
	const GLuint pixel_size = Utils::getPixelSizeForFormat(test_case.m_internal_format);
	const GLuint line_size  = pixel_size * m_width;

	GLuint height = m_height;

	if ((GL_TEXTURE_1D == test_case.m_target) || (GL_TEXTURE_1D_ARRAY == test_case.m_target))
	{
		height = 1;
	}

	/* For each line */
	for (GLuint y = 0; y < height; ++y)
	{
		/* Offsets */
		const GLuint line_offset = y * line_size;

		/* Pointers */
		const GLubyte* left_line_data  = left_data + line_offset;
		const GLubyte* right_line_data = right_data + line_offset;

		/* For each pixel of region */
		for (GLuint x = 0; x < m_width; ++x)
		{
			/* Offsets */
			const GLuint pixel_offset = x * pixel_size;

			/* Pointers */
			const GLubyte* left_pixel_data  = left_line_data + pixel_offset;
			const GLubyte* right_pixel_data = right_line_data + pixel_offset;

			/* Compare */
			if (false == Utils::comparePixels(pixel_size, left_pixel_data, pixel_size, right_pixel_data,
											  test_case.m_internal_format))
			{
				if (false == Utils::unpackAndComaprePixels(
								 test_case.m_format, test_case.m_type, test_case.m_internal_format, left_pixel_data,
								 test_case.m_format, test_case.m_type, test_case.m_internal_format, right_pixel_data))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Not matching pixels found. "
						<< "[" << x << ", " << y << "], off: " << left_pixel_data - left_data
						<< ". Data left: " << Utils::getPixelString(test_case.m_internal_format, left_pixel_data)
						<< ", right: " << Utils::getPixelString(test_case.m_internal_format, right_pixel_data)
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}